

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O0

StackSym * __thiscall StackSym::GetTypeEquivSym(StackSym *this,IRType type,Func *func)

{
  bool bVar1;
  SymID id;
  RegSlot byteCodeRegSlot;
  Func *func_00;
  StackSym *local_30;
  StackSym *sym;
  Func *func_local;
  IRType type_local;
  StackSym *this_local;
  
  this_local = GetTypeEquivSym_NoCreate(this,type);
  if (this_local == (StackSym *)0x0) {
    if (func == (Func *)0x0) {
      this_local = (StackSym *)0x0;
    }
    else {
      bVar1 = HasByteCodeRegSlot(this);
      if (bVar1) {
        id = SymTable::NewID(func->m_symTable);
        byteCodeRegSlot = GetByteCodeRegSlot(this);
        func_00 = GetByteCodeFunc(this);
        local_30 = New(id,type,byteCodeRegSlot,func_00);
      }
      else {
        local_30 = New(type,func);
      }
      local_30->m_equivNext = this->m_equivNext;
      this->m_equivNext = local_30;
      if (type != TyVar) {
        *(uint *)&local_30->field_0x18 = *(uint *)&local_30->field_0x18 & 0xfffeffff | 0x10000;
      }
      this_local = local_30;
    }
  }
  return this_local;
}

Assistant:

StackSym *
StackSym::GetTypeEquivSym(IRType type, Func *func)
{
    StackSym *sym = this->GetTypeEquivSym_NoCreate(type);

    if (sym != nullptr)
    {
        return sym;
    }

    // Don't allocate if func wasn't passed in.
    if (func == nullptr)
    {
        return nullptr;
    }

    if (this->HasByteCodeRegSlot())
    {
        sym = StackSym::New(func->m_symTable->NewID(), type,
            this->GetByteCodeRegSlot(), this->GetByteCodeFunc());
    }
    else
    {
        sym = StackSym::New(type, func);
    }
    sym->m_equivNext = this->m_equivNext;
    this->m_equivNext = sym;
    if (type != TyVar)
    {
        sym->m_isTypeSpec = true;
    }

    return sym;
}